

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PagerExclusiveLock(Pager *pPager)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 0;
  if (pPager->pWal == (Wal *)0x0) {
    do {
      iVar1 = 0;
      if (((pPager->eLock < 4) || (pPager->eLock == 5)) &&
         (iVar1 = (*pPager->fd->pMethods->xLock)(pPager->fd,4), iVar1 == 0)) {
        pPager->eLock = '\x04';
        iVar1 = 0;
      }
    } while ((iVar1 == 5) && (iVar2 = (*pPager->xBusyHandler)(pPager->pBusyHandlerArg), iVar2 != 0))
    ;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerExclusiveLock(Pager *pPager){
  int rc = SQLITE_OK;
  assert( pPager->eState==PAGER_WRITER_CACHEMOD 
       || pPager->eState==PAGER_WRITER_DBMOD 
       || pPager->eState==PAGER_WRITER_LOCKED 
  );
  assert( assert_pager_state(pPager) );
  if( 0==pagerUseWal(pPager) ){
    rc = pager_wait_on_lock(pPager, EXCLUSIVE_LOCK);
  }
  return rc;
}